

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecBit.h
# Opt level: O0

void Vec_BitGrow(Vec_Bit_t *p,int nCapMin)

{
  int iVar1;
  int *local_20;
  int nCapMin_local;
  Vec_Bit_t *p_local;
  
  if (p->nCap < nCapMin) {
    iVar1 = (nCapMin >> 5) + (uint)((nCapMin & 0x1fU) != 0);
    if (p->pArray == (int *)0x0) {
      local_20 = (int *)malloc((long)iVar1 << 2);
    }
    else {
      local_20 = (int *)realloc(p->pArray,(long)iVar1 << 2);
    }
    p->pArray = local_20;
    if (p->pArray == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                    ,0x163,"void Vec_BitGrow(Vec_Bit_t *, int)");
    }
    p->nCap = iVar1 * 0x20;
  }
  return;
}

Assistant:

static inline void Vec_BitGrow( Vec_Bit_t * p, int nCapMin )
{
    if ( p->nCap >= nCapMin )
        return;
    nCapMin = (nCapMin >> 5) + ((nCapMin & 31) > 0);
    p->pArray = ABC_REALLOC( int, p->pArray, nCapMin ); 
    assert( p->pArray );
    p->nCap   = nCapMin * 32;
}